

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Scope * enter_D_Scope(D_Scope *current,D_Scope *scope)

{
  D_Scope *pDVar1;
  D_Scope *__s;
  D_Scope *parent;
  D_Scope *st;
  D_Scope *scope_local;
  D_Scope *current_local;
  
  __s = (D_Scope *)malloc(0x50);
  pDVar1 = scope->up;
  memset(__s,0,0x50);
  __s->depth = scope->depth;
  __s->up = pDVar1;
  *(byte *)__s = *(byte *)__s & 0xfc | *(byte *)scope & 3;
  __s->search = scope;
  __s->up_updates = current;
  __s->down_next = current->down;
  current->down = __s;
  return __s;
}

Assistant:

D_Scope *enter_D_Scope(D_Scope *current, D_Scope *scope) {
  D_Scope *st = MALLOC(sizeof(D_Scope)), *parent = scope->up;
  memset(st, 0, sizeof(D_Scope));
  st->depth = scope->depth;
  st->up = parent;
  st->kind = scope->kind;
  st->search = scope;
#if 0
  /* clear old updates */
  {
    D_Scope *update_scope = current;
    while (update_scope) {
      D_Sym *sy = update_scope->updates;
      while (sy) {
        if (sy->scope->depth <= current->depth)
          goto Lfound;
        sy = sy->next;
      }
      update_scope = update_scope->up_updates;
    }
Lfound:
    st->up_updates = update_scope;
  }
#else
  st->up_updates = current;
#endif
  st->down_next = current->down;
  current->down = st;
  return st;
}